

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scopes_unique.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  shared_ptr<i1> local_38;
  shared_ptr<i1> local_28;
  dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  local_f [3];
  int local_c;
  i injector;
  
  local_c = 0;
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<i1>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::in<boost::ext::di::v1_3_0::scopes::unique,_0>(this,(unique *)&boost::ext::di::v1_3_0::unique);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<impl1,_0,_0>(local_f);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ();
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::shared_ptr<i1>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)&local_28);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::shared_ptr<i1>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)&local_38);
  bVar1 = std::operator!=(&local_28,&local_38);
  if (!bVar1) {
    __assert_fail("injector.create<std::shared_ptr<i1>>() != injector.create<std::shared_ptr<i1>>()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/scopes_unique.cpp"
                  ,0x1e,"int main()");
  }
  std::shared_ptr<i1>::~shared_ptr(&local_38);
  std::shared_ptr<i1>::~shared_ptr(&local_28);
  return local_c;
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<i1>().in(di::unique).to<impl1>()
  );
  // clang-format on

  assert(injector.create<std::shared_ptr<i1>>() != injector.create<std::shared_ptr<i1>>());
}